

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

void pnga_sprs_array_get_diag(Integer s_a,Integer *g_d)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  size_t __size;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  _sparse_array *p_Var7;
  Integer *mapc;
  Integer *pIVar8;
  Integer IVar9;
  Integer proc;
  Integer IVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  void *diag;
  void *vptr;
  int *jptr;
  int *iptr;
  char op [2];
  Integer ihi;
  Integer ilo;
  Integer one;
  Integer nproc;
  Integer hi;
  Integer lo;
  Integer jhi;
  Integer jlo;
  long local_c0;
  Integer local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  int local_90;
  char local_8a [2];
  Integer *local_88;
  Integer *local_80;
  long local_78;
  long local_70;
  Integer local_68;
  Integer local_60;
  Integer local_58;
  Integer local_50;
  Integer local_48;
  Integer local_40;
  Integer local_38;
  
  lVar1 = s_a + 1000;
  IVar10 = SPA[lVar1].grp;
  local_b8 = s_a;
  local_80 = g_d;
  proc = pnga_pgroup_nodeid(IVar10);
  local_60 = pnga_pgroup_nnodes(IVar10);
  local_68 = 1;
  local_b0 = (ulong)(uint)SPA[lVar1].idx_size;
  bVar19 = _ga_sync_begin != 0;
  local_90 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar19) {
    pnga_pgroup_sync(IVar10);
  }
  IVar9 = local_60;
  __size = local_60 * 8 + 8;
  local_88 = (Integer *)malloc(__size);
  if (-1 < IVar9) {
    memset(local_88,0,__size);
  }
  mapc = local_88;
  p_Var7 = SPA;
  local_88[proc] = SPA[lVar1].ilo + 1;
  if (proc == IVar9 + -1) {
    local_88[proc + 1] = p_Var7[lVar1].ihi + 1;
  }
  local_8a[0] = '+';
  local_8a[1] = '\0';
  local_58 = IVar10;
  pnga_pgroup_gop(IVar10,0x3ea,local_88,IVar9 + 1,local_8a);
  IVar10 = pnga_create_handle();
  pIVar8 = local_80;
  *local_80 = IVar10;
  pnga_set_data(IVar10,local_68,&SPA[lVar1].idim,SPA[lVar1].type);
  pnga_set_pgroup(*pIVar8,SPA[lVar1].grp);
  pnga_set_irreg_distr(*pIVar8,mapc,&local_60);
  pnga_allocate(*pIVar8);
  pnga_zero(*pIVar8);
  pnga_distribution(*pIVar8,proc,&local_48,&local_50);
  pnga_access_ptr(*pIVar8,&local_48,&local_50,&local_c0,&local_68);
  IVar10 = local_b8;
  pnga_sprs_array_row_distribution(local_b8,proc,&local_70,&local_78);
  pnga_sprs_array_column_distribution(IVar10,proc,&local_38,&local_40);
  if ((int)local_b0 == 4) {
    pnga_sprs_array_access_col_block(IVar10,proc,&local_98,&local_a0,&local_a8);
    local_b8 = local_70;
    local_b0 = local_78;
    lVar17 = local_70;
    if (local_70 <= local_78) {
      do {
        iVar4 = *(int *)(local_98 + ((lVar17 + 1) - local_70) * 4);
        lVar14 = lVar17 - local_70;
        iVar5 = *(int *)(local_98 + lVar14 * 4);
        uVar11 = iVar4 - iVar5;
        if (uVar11 != 0 && iVar5 <= iVar4) {
          uVar15 = 0;
          do {
            lVar12 = (long)*(int *)(local_98 + lVar14 * 4) + uVar15;
            if (lVar17 == *(int *)(local_a0 + lVar12 * 4)) {
              switch(SPA[lVar1].type) {
              case 0x3e9:
                *(undefined4 *)(local_c0 + lVar14 * 4) = *(undefined4 *)(local_a8 + lVar12 * 4);
                break;
              case 0x3ea:
              case 0x3f8:
                *(undefined8 *)(local_c0 + lVar14 * 8) = *(undefined8 *)(local_a8 + lVar12 * 8);
                break;
              case 0x3eb:
                *(undefined4 *)(local_c0 + lVar14 * 4) = *(undefined4 *)(local_a8 + lVar12 * 4);
                break;
              case 0x3ec:
                *(undefined8 *)(local_c0 + lVar14 * 8) = *(undefined8 *)(local_a8 + lVar12 * 8);
                break;
              case 0x3ee:
                *(undefined8 *)(local_c0 + lVar14 * 8) = *(undefined8 *)(local_a8 + lVar12 * 8);
                break;
              case 0x3ef:
                puVar2 = (undefined8 *)(local_a8 + lVar12 * 0x10);
                uVar6 = puVar2[1];
                puVar3 = (undefined8 *)(local_c0 + lVar14 * 0x10);
                *puVar3 = *puVar2;
                puVar3[1] = uVar6;
              }
            }
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
        }
        bVar19 = lVar17 != local_78;
        lVar17 = lVar17 + 1;
      } while (bVar19);
    }
  }
  else {
    pnga_sprs_array_access_col_block(IVar10,proc,&local_98,&local_a0,&local_a8);
    local_b8 = local_70;
    local_b0 = local_78;
    lVar17 = local_70;
    if (local_70 <= local_78) {
      do {
        lVar14 = *(long *)(local_98 + ((lVar17 + 1) - local_70) * 8);
        lVar18 = lVar17 - local_70;
        lVar12 = *(long *)(local_98 + lVar18 * 8);
        if (lVar12 < lVar14) {
          lVar16 = 0;
          do {
            lVar13 = *(long *)(local_98 + lVar18 * 8) + lVar16;
            if (lVar17 == *(long *)(local_a0 + lVar13 * 8)) {
              switch(SPA[lVar1].type) {
              case 0x3e9:
                *(undefined4 *)(local_c0 + lVar18 * 4) = *(undefined4 *)(local_a8 + lVar13 * 4);
                break;
              case 0x3ea:
              case 0x3f8:
                *(undefined8 *)(local_c0 + lVar18 * 8) = *(undefined8 *)(local_a8 + lVar13 * 8);
                break;
              case 0x3eb:
                *(undefined4 *)(local_c0 + lVar18 * 4) = *(undefined4 *)(local_a8 + lVar13 * 4);
                break;
              case 0x3ec:
                *(undefined8 *)(local_c0 + lVar18 * 8) = *(undefined8 *)(local_a8 + lVar13 * 8);
                break;
              case 0x3ee:
                *(undefined8 *)(local_c0 + lVar18 * 8) = *(undefined8 *)(local_a8 + lVar13 * 8);
                break;
              case 0x3ef:
                puVar2 = (undefined8 *)(local_a8 + lVar13 * 0x10);
                uVar6 = puVar2[1];
                puVar3 = (undefined8 *)(local_c0 + lVar18 * 0x10);
                *puVar3 = *puVar2;
                puVar3[1] = uVar6;
              }
            }
            lVar16 = lVar16 + 1;
          } while (lVar14 - lVar12 != lVar16);
        }
        bVar19 = lVar17 != local_78;
        lVar17 = lVar17 + 1;
      } while (bVar19);
    }
  }
  free(local_88);
  pnga_release_update(*local_80,&local_48,&local_50);
  if (local_90 != 0) {
    pnga_pgroup_sync(local_58);
  }
  return;
}

Assistant:

void pnga_sprs_array_get_diag(Integer s_a, Integer *g_d)
{
  Integer hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer *map;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer iproc;
  Integer one = 1;
  Integer lo, hi;
  Integer ilo, ihi, jlo, jhi, ncols;
  int *iptr, *jptr;
  int64_t *ilptr, *jlptr;
  int idx_size = SPA[hdl].idx_size;
  Integer i, j;
  void *diag, *vptr;
  char op[2];


  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);
  /* Get row distribution of matrix */
  map = (Integer*)malloc((nproc+1)*sizeof(Integer));
  for (iproc=0; iproc<nproc+1; iproc++) map[iproc] = 0;
  map[me] = SPA[hdl].ilo+1;
  if (me == nproc-1) map[me+1] = SPA[hdl].ihi+1;
  op[0] = '+';
  op[1] = '\0';
  if (sizeof(Integer) == 4) {
    pnga_pgroup_gop(grp, C_INT, map, nproc+1, op);
  } else {
    pnga_pgroup_gop(grp, C_LONG, map, nproc+1, op);
  }
  /* Create array to hold diagonal */
  *g_d = pnga_create_handle();
  pnga_set_data(*g_d,one,&SPA[hdl].idim,SPA[hdl].type);
  pnga_set_pgroup(*g_d,SPA[hdl].grp);
  pnga_set_irreg_distr(*g_d,map,&nproc);
  pnga_allocate(*g_d);
  /* zero all elements. If diagonal element is not found for a row, then it
   * must be zero */
  pnga_zero(*g_d);
  pnga_distribution(*g_d,me,&lo,&hi);
  pnga_access_ptr(*g_d, &lo, &hi, &diag, &one);
  /* extract diagonal elements */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  pnga_sprs_array_column_distribution(s_a,me,&jlo,&jhi);
  if (idx_size == 4) {
    pnga_sprs_array_access_col_block(s_a,me,&iptr,&jptr,&vptr);
    for (i=ilo; i<=ihi; i++) {
      ncols = iptr[i+1-ilo]-iptr[i-ilo];
      for (j=0; j<ncols; j++) {
        if (i == jptr[iptr[i-ilo]+j]) {
          if (SPA[hdl].type == C_INT) {
            ((int*)diag)[i-ilo] = ((int*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_LONG) {
            ((long*)diag)[i-ilo] = ((long*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_LONGLONG) {
            ((long long*)diag)[i-ilo] = ((long long*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_FLOAT) {
            ((float*)diag)[i-ilo] = ((float*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_DBL) {
            ((double*)diag)[i-ilo] = ((double*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_SCPL) {
            ((SingleComplex*)diag)[i-ilo] = ((SingleComplex*)vptr)[iptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_DCPL) {
            ((DoubleComplex*)diag)[i-ilo] = ((DoubleComplex*)vptr)[iptr[i-ilo]+j];
          }
        }
      }
    }
  } else {
    pnga_sprs_array_access_col_block(s_a,me,&ilptr,&jlptr,&vptr);
    for (i=ilo; i<=ihi; i++) {
      ncols = ilptr[i+1-ilo]-ilptr[i-ilo];
      for (j=0; j<ncols; j++) {
        if (i == jlptr[ilptr[i-ilo]+j]) {
          if (SPA[hdl].type == C_INT) {
            ((int*)diag)[i-ilo] = ((int*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_LONG) {
            ((long*)diag)[i-ilo] = ((long*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_LONGLONG) {
            ((long long*)diag)[i-ilo] = ((long long*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_FLOAT) {
            ((float*)diag)[i-ilo] = ((float*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_DBL) {
            ((double*)diag)[i-ilo] = ((double*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_SCPL) {
            ((SingleComplex*)diag)[i-ilo] = ((SingleComplex*)vptr)[ilptr[i-ilo]+j];
          } else if (SPA[hdl].type == C_DCPL) {
            ((DoubleComplex*)diag)[i-ilo] = ((DoubleComplex*)vptr)[ilptr[i-ilo]+j];
          }
        }
      }
    }
  }
  free(map);
  pnga_release_update(*g_d, &lo, &hi);
  if (local_sync_end) pnga_pgroup_sync(grp);
}